

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

coda_type_special * coda_type_no_data_singleton(coda_format format)

{
  int iVar1;
  coda_type_special *pcVar2;
  coda_type_raw *type;
  long in_FS_OFFSET;
  
  if ((coda_format_rinex|coda_format_xml) < format) {
    __assert_fail("format < num_no_data_singletons",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                  ,0x8ac,"coda_type_special *coda_type_no_data_singleton(coda_format)");
  }
  pcVar2 = *(coda_type_special **)(in_FS_OFFSET + (ulong)format * 8 + -0x140);
  if (pcVar2 == (coda_type_special *)0x0) {
    pcVar2 = (coda_type_special *)malloc(0x58);
    if (pcVar2 == (coda_type_special *)0x0) {
      pcVar2 = (coda_type_special *)0x0;
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x58,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                     ,0x8b6);
    }
    else {
      pcVar2->format = format;
      pcVar2->retain_count = 0;
      pcVar2->type_class = coda_special_class;
      pcVar2->read_type = coda_native_type_not_available;
      pcVar2->name = (char *)0x0;
      pcVar2->description = (char *)0x0;
      pcVar2->bit_size = 0;
      pcVar2->size_expr = (coda_expression *)0x0;
      *(undefined8 *)((long)&pcVar2->size_expr + 4) = 0;
      *(undefined8 *)((long)&pcVar2->attributes + 4) = 0;
      pcVar2->unit = (char *)0x0;
      pcVar2->value_expr = (coda_expression *)0x0;
      type = coda_type_raw_new(format);
      pcVar2->base_type = (coda_type *)type;
      if ((type != (coda_type_raw *)0x0) &&
         (iVar1 = coda_type_set_bit_size((coda_type *)type,0), iVar1 == 0)) {
        *(coda_type_special **)(in_FS_OFFSET + (ulong)format * 8 + -0x140) = pcVar2;
        return pcVar2;
      }
      special_delete(pcVar2);
      pcVar2 = (coda_type_special *)0x0;
    }
  }
  return pcVar2;
}

Assistant:

coda_type_special *coda_type_no_data_singleton(coda_format format)
{
    assert(format < num_no_data_singletons);

    if (no_data_singleton[format] == NULL)
    {
        coda_type_special *type;

        type = (coda_type_special *)malloc(sizeof(coda_type_special));
        if (type == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)sizeof(coda_type_special), __FILE__, __LINE__);
            return NULL;
        }
        type->format = format;
        type->retain_count = 0;
        type->type_class = coda_special_class;
        type->read_type = coda_native_type_not_available;
        type->name = NULL;
        type->description = NULL;
        type->bit_size = 0;
        type->size_expr = NULL;
        type->attributes = NULL;
        type->special_type = coda_special_no_data;
        type->base_type = NULL;
        type->unit = NULL;
        type->value_expr = NULL;

        type->base_type = (coda_type *)coda_type_raw_new(format);
        if (type->base_type == NULL)
        {
            special_delete(type);
            return NULL;
        }
        if (coda_type_set_bit_size(type->base_type, 0) != 0)
        {
            special_delete(type);
            return NULL;
        }

        no_data_singleton[format] = type;
    }

    return no_data_singleton[format];
}